

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_from(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  int64_t iVar6;
  ulong uVar7;
  JSRefCountHeader *p;
  JSValueUnion JVar8;
  int64_t iVar9;
  int64_t iVar10;
  long idx;
  JSValueUnion JVar11;
  int64_t iVar12;
  ulong idx_00;
  ulong uVar13;
  bool bVar14;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj;
  JSValue enum_obj;
  JSValue obj;
  JSValue func_obj;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValue JVar18;
  JSValue this_obj_00;
  int64_t iStackY_110;
  ulong in_stack_fffffffffffffef8;
  JSValue *argv_00;
  BOOL *pdone;
  JSValueUnion local_e8;
  int64_t local_d8;
  void *local_c0;
  int64_t local_b0;
  int done;
  JSValueUnion local_98;
  int64_t local_90;
  JSValueUnion local_88;
  int64_t local_80;
  ulong local_78;
  ulong local_70;
  int64_t local_68;
  int64_t len;
  JSValueUnion local_58;
  int64_t local_50;
  ulong local_48;
  undefined8 local_40;
  
  JVar8 = (JSValueUnion)(argv->u).ptr;
  iVar10 = argv->tag;
  JVar18 = *argv;
  JVar17 = *argv;
  JVar15 = *argv;
  local_98.float64 = local_98.float64 & 0xffffffff00000000;
  local_88.int32 = 0;
  local_80 = 3;
  iVar6 = 3;
  bVar1 = true;
  if (argc < 2) {
    uVar7 = 0;
    uVar13 = 0;
    local_b0 = 3;
    local_c0 = (void *)0x0;
    local_70 = 0;
LAB_0015d077:
    argv_00 = (JSValue *)(in_stack_fffffffffffffef8 & 0xffffffff00000000);
    JVar15 = JS_GetPropertyInternal(ctx,JVar15,0xc6,JVar17,0);
    if ((int)JVar15.tag != 3) {
      if ((int)JVar15.tag != 6) {
        local_78 = uVar7;
        JS_FreeValue(ctx,JVar15);
        JVar15 = JS_NewArray(ctx);
        if ((int)JVar15.tag == 6) {
          uVar3 = 0;
          iStackY_110 = 3;
          local_d8 = 3;
          uVar7 = 0;
          iVar10 = iStackY_110;
        }
        else {
          if (0xfffffff4 < (uint)iVar10) {
            *(int *)JVar8.ptr = *JVar8.ptr + 1;
          }
          local_98 = JVar8;
          local_90 = iVar10;
          iVar2 = js_for_of_start(ctx,(JSValue *)&local_88,0);
          iVar10 = local_80;
          iVar9 = local_90;
          JVar8 = local_98;
          local_d8 = local_90;
          if (iVar2 == 0) {
            JVar17.u._4_4_ = local_88._4_4_;
            JVar17.u.int32 = local_88.int32;
            idx = 0;
            do {
              pdone = (BOOL *)JVar15.tag;
              local_e8 = JVar15.u;
              JVar18.tag = iVar9;
              JVar18.u.ptr = JVar8.ptr;
              JVar17.tag = iVar10;
              JVar15 = JS_IteratorNext(ctx,JVar18,JVar17,(int)&done,argv_00,pdone);
              if ((int)JVar15.tag == 6) break;
              if (done != 0) {
                JVar15.tag = (int64_t)pdone;
                JVar15.u.ptr = local_e8.ptr;
                goto LAB_0015d1b3;
              }
              argv_00 = (JSValue *)CONCAT44((int)((ulong)argv_00 >> 0x20),0x4007);
              this_obj.tag = (int64_t)pdone;
              this_obj.u.ptr = local_e8.ptr;
              iVar2 = JS_DefinePropertyValueInt64(ctx,this_obj,idx,JVar15,0x4007);
              JVar15.tag = (int64_t)pdone;
              JVar15.u.ptr = local_e8.ptr;
              idx = idx + 1;
            } while (-1 < iVar2);
            iStackY_110 = 3;
            if ((int)iVar9 != 3) {
              enum_obj.tag = iVar9;
              enum_obj.u.ptr = JVar8.ptr;
              JS_IteratorClose(ctx,enum_obj,1);
            }
            uVar3 = 0;
            uVar7 = 0;
            JVar15.tag = (int64_t)pdone;
            JVar15.u.ptr = local_e8.ptr;
          }
          else {
            iStackY_110 = 3;
            uVar7 = 0;
            uVar3 = 0;
          }
        }
        goto LAB_0015d147;
      }
      goto LAB_0015d133;
    }
    local_78 = uVar7;
    JVar15 = JS_ToObject(ctx,JVar18);
    iStackY_110 = 3;
    iVar10 = iStackY_110;
    if ((int)JVar15.tag == 6) {
      uVar3 = 0;
      local_d8 = 3;
      uVar7 = 0;
      goto LAB_0015d147;
    }
    local_d8 = 3;
LAB_0015d1b3:
    iVar9 = JVar15.tag;
    JVar8 = JVar15.u;
    iVar2 = js_get_length64(ctx,&len,JVar15);
    if (-1 < iVar2) {
      bVar14 = (int)len == len;
      JVar11.float64 = (double)len;
      if (bVar14) {
        JVar11.ptr = (void *)(len & 0xffffffff);
      }
      iVar12 = 7;
      if (bVar14) {
        iVar12 = 0;
      }
      local_50 = iVar12;
      local_58.float64 = JVar11.float64;
      local_68 = iVar6;
      JVar17 = js_typed_array_create(ctx,this_val,1,(JSValue *)&local_58);
      iStackY_110 = JVar17.tag;
      JVar4 = JVar17.u;
      uVar7 = (ulong)JVar4.ptr >> 0x20;
      v_02.tag = iVar12;
      v_02.u.float64 = JVar11.float64;
      JS_FreeValue(ctx,v_02);
      if ((int)JVar17.tag != 6) {
        uVar5 = local_70 << 0x20;
        JVar11.ptr = (void *)(uVar13 | local_78);
        idx_00 = 0;
        uVar13 = len;
        if (len < 1) {
          uVar13 = idx_00;
        }
        do {
          JVar15.tag = iVar9;
          JVar15.u.ptr = JVar8.ptr;
          if (uVar13 == idx_00) {
            uVar7 = (ulong)JVar4.ptr & 0xffffffff00000000;
            uVar13 = (ulong)JVar4.ptr & 0xffffffff;
            goto LAB_0015d160;
          }
          obj.tag = iVar9;
          obj.u.ptr = JVar8.ptr;
          JVar15 = JS_GetPropertyInt64(ctx,obj,idx_00);
          if ((int)JVar15.tag == 6) break;
          JVar18 = JVar15;
          if (!bVar1) {
            local_48 = idx_00 & 0xffffffff;
            local_40 = 0;
            func_obj.tag = local_b0;
            func_obj.u.ptr = (void *)((ulong)local_c0 & 0xffffffff | uVar5);
            this_obj_00.tag = local_68;
            this_obj_00.u.ptr = JVar11.ptr;
            _local_58 = JVar15;
            JVar18 = JS_Call(ctx,func_obj,this_obj_00,2,(JSValue *)&local_58);
            JS_FreeValue(ctx,JVar15);
            if ((int)JVar18.tag == 6) break;
          }
          iVar2 = JS_SetPropertyInt64(ctx,JVar17,idx_00,JVar18);
          idx_00 = idx_00 + 1;
        } while (-1 < iVar2);
      }
      JVar15.tag = iVar9;
      JVar15.u.ptr = JVar8.ptr;
      uVar3 = JVar17.u._0_4_;
      goto LAB_0015d147;
    }
  }
  else {
    local_c0 = argv[1].u.ptr;
    local_b0 = argv[1].tag;
    local_70 = (ulong)local_c0 >> 0x20;
    if ((int)local_b0 == 3) {
LAB_0015d04f:
      iVar6 = 3;
      uVar7 = 0;
      uVar13 = 0;
      goto LAB_0015d077;
    }
    iVar2 = check_function(ctx,argv[1]);
    if (iVar2 == 0) {
      if (argc != 2) {
        iVar6 = argv[2].tag;
        uVar7 = (ulong)argv[2].u.ptr & 0xffffffff;
        uVar13 = (ulong)argv[2].u.ptr & 0xffffffff00000000;
        bVar1 = false;
        goto LAB_0015d077;
      }
      bVar1 = false;
      goto LAB_0015d04f;
    }
LAB_0015d133:
    iVar10 = 3;
    JVar15 = (JSValue)(ZEXT816(3) << 0x40);
    local_d8 = 3;
  }
  iStackY_110 = 3;
  uVar3 = 0;
  uVar7 = 0;
LAB_0015d147:
  v.u.ptr = (void *)((ulong)uVar3 | uVar7 << 0x20);
  v.tag = iStackY_110;
  JS_FreeValue(ctx,v);
  iStackY_110 = 6;
  uVar13 = 0;
  uVar7 = 0;
LAB_0015d160:
  JS_FreeValue(ctx,JVar15);
  v_00.tag = local_d8;
  v_00.u.float64 = local_98.float64;
  JS_FreeValue(ctx,v_00);
  v_01.u._4_4_ = local_88._4_4_;
  v_01.u.int32 = local_88.int32;
  v_01.tag = iVar10;
  JS_FreeValue(ctx,v_01);
  JVar16.tag = iStackY_110;
  JVar16.u.ptr = (void *)(uVar13 | uVar7);
  return JVar16;
}

Assistant:

static JSValue js_typed_array_from(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    // from(items, mapfn = void 0, this_arg = void 0)
    JSValueConst items = argv[0], mapfn, this_arg;
    JSValueConst args[2];
    JSValue stack[2];
    JSValue iter, arr, r, v, v2;
    int64_t k, len;
    int done, mapping;

    mapping = FALSE;
    mapfn = JS_UNDEFINED;
    this_arg = JS_UNDEFINED;
    r = JS_UNDEFINED;
    arr = JS_UNDEFINED;
    stack[0] = JS_UNDEFINED;
    stack[1] = JS_UNDEFINED;

    if (argc > 1) {
        mapfn = argv[1];
        if (!JS_IsUndefined(mapfn)) {
            if (check_function(ctx, mapfn))
                goto exception;
            mapping = 1;
            if (argc > 2)
                this_arg = argv[2];
        }
    }
    iter = JS_GetProperty(ctx, items, JS_ATOM_Symbol_iterator);
    if (JS_IsException(iter))
        goto exception;
    if (!JS_IsUndefined(iter)) {
        JS_FreeValue(ctx, iter);
        arr = JS_NewArray(ctx);
        if (JS_IsException(arr))
            goto exception;
        stack[0] = JS_DupValue(ctx, items);
        if (js_for_of_start(ctx, &stack[1], FALSE))
            goto exception;
        for (k = 0;; k++) {
            v = JS_IteratorNext(ctx, stack[0], stack[1], 0, NULL, &done);
            if (JS_IsException(v))
                goto exception_close;
            if (done)
                break;
            if (JS_DefinePropertyValueInt64(ctx, arr, k, v, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception_close;
        }
    } else {
        arr = JS_ToObject(ctx, items);
        if (JS_IsException(arr))
            goto exception;
    }
    if (js_get_length64(ctx, &len, arr) < 0)
        goto exception;
    v = JS_NewInt64(ctx, len);
    args[0] = v;
    r = js_typed_array_create(ctx, this_val, 1, args);
    JS_FreeValue(ctx, v);
    if (JS_IsException(r))
        goto exception;
    for(k = 0; k < len; k++) {
        v = JS_GetPropertyInt64(ctx, arr, k);
        if (JS_IsException(v))
            goto exception;
        if (mapping) {
            args[0] = v;
            args[1] = JS_NewInt32(ctx, k);
            v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
            JS_FreeValue(ctx, v);
            v = v2;
            if (JS_IsException(v))
                goto exception;
        }
        if (JS_SetPropertyInt64(ctx, r, k, v) < 0)
            goto exception;
    }
    goto done;

 exception_close:
    if (!JS_IsUndefined(stack[0]))
        JS_IteratorClose(ctx, stack[0], TRUE);
 exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
 done:
    JS_FreeValue(ctx, arr);
    JS_FreeValue(ctx, stack[0]);
    JS_FreeValue(ctx, stack[1]);
    return r;
}